

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

void Saig_ManWindowCreatePos(Aig_Man_t *pNew,Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pObj;
  int local_4c;
  int i;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  Aig_Man_t *pNew_local;
  
  local_4c = 0;
  do {
    iVar1 = Vec_PtrSize(p0->vObjs);
    if (iVar1 <= local_4c) {
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_4c);
    if ((((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3), iVar1 == 0))
        && (iVar1 = Aig_ObjIsConst1(pAVar3), iVar1 == 0)) &&
       (iVar1 = Aig_ObjIsCi(pAVar3), iVar1 == 0)) {
      pAVar4 = Aig_ObjRepr(p0,pAVar3);
      pAVar5 = Aig_ObjRepr(p1,pAVar4);
      if (pAVar3 != pAVar5) {
        __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                      ,0x298,"void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
      }
      iVar1 = Aig_ObjIsCo(pAVar3);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pAVar3);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                        ,0x2a7,"void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)"
                       );
        }
        pAVar5 = Aig_ObjFanin0(pAVar3);
        pObj = Aig_ObjFanin0(pAVar4);
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar5);
        iVar2 = Aig_ObjIsTravIdCurrent(p1,pObj);
        if (iVar1 != iVar2) {
          __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                        ,0x2ac,"void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)"
                       );
        }
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar5);
        if (iVar1 != 0) {
          pAVar5 = Aig_Exor(pNew,(Aig_Obj_t *)(pAVar5->field_5).pData,
                            (Aig_Obj_t *)(pObj->field_5).pData);
          Aig_ObjCreateCo(pNew,pAVar5);
        }
        pAVar3 = Aig_ObjFanin1(pAVar3);
        pAVar4 = Aig_ObjFanin1(pAVar4);
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3);
        iVar2 = Aig_ObjIsTravIdCurrent(p1,pAVar4);
        if (iVar1 != iVar2) {
          __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                        ,0x2b6,"void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)"
                       );
        }
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3);
        if (iVar1 != 0) {
          pAVar3 = Aig_Exor(pNew,(Aig_Obj_t *)(pAVar3->field_5).pData,
                            (Aig_Obj_t *)(pAVar4->field_5).pData);
          Aig_ObjCreateCo(pNew,pAVar3);
        }
      }
      else {
        pAVar3 = Aig_ObjFanin0(pAVar3);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3);
        iVar2 = Aig_ObjIsTravIdCurrent(p1,pAVar4);
        if (iVar1 != iVar2) {
          __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                        ,0x29e,"void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)"
                       );
        }
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3);
        if (iVar1 != 0) {
          pAVar3 = Aig_Exor(pNew,(Aig_Obj_t *)(pAVar3->field_5).pData,
                            (Aig_Obj_t *)(pAVar4->field_5).pData);
          Aig_ObjCreateCo(pNew,pAVar3);
        }
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void Saig_ManWindowCreatePos( Aig_Man_t * pNew, Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1, * pMiter;
    Aig_Obj_t * pFanin0, * pFanin1;
    int i;
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p0, pObj0) )
            continue;
        if ( Aig_ObjIsConst1(pObj0) )
            continue;
        if ( Aig_ObjIsCi(pObj0) )
            continue;
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsCo(pObj0) )
        {
            pFanin0 = Aig_ObjFanin0(pObj0);
            pFanin1 = Aig_ObjFanin0(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }
        }
        else
        {
            assert( Aig_ObjIsNode(pObj0) );

            pFanin0 = Aig_ObjFanin0(pObj0);
            pFanin1 = Aig_ObjFanin0(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }

            pFanin0 = Aig_ObjFanin1(pObj0);
            pFanin1 = Aig_ObjFanin1(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }
        }
    }
}